

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::HlslParseContext::executeInitializer
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  TQualifier *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TArraySizes *pTVar8;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TArraySizes *this_01;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  char *pcVar9;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  TConstUnionArray *pTVar10;
  undefined4 extraout_var_31;
  TString local_1c0;
  TString local_198;
  HlslParseContext *local_170;
  TIntermNode *initNode;
  TIntermSymbol *intermSymbol;
  TString local_158;
  pool_allocator<char> local_130;
  TString local_128;
  TString local_100;
  int local_d8;
  undefined4 local_d4;
  int d;
  TType skeletalType;
  TStorageQualifier qualifier;
  TVariable *variable_local;
  TIntermTyped *initializer_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))();
  skeletalType.spirvType._4_4_ = (uint)*(undefined8 *)(lVar6 + 8) & 0x7f;
  TType::TType((TType *)&d,EbtVoid,EvqTemporary,1,0,0,false);
  iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  TType::shallowCopy((TType *)&d,(TType *)CONCAT44(extraout_var_00,iVar3));
  this_00 = TType::getQualifier((TType *)&d);
  TQualifier::makeTemporary(this_00);
  iVar3 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
  variable_local = (TVariable *)initializer;
  if (CONCAT44(extraout_var_01,iVar3) != 0) {
    iVar3 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
    TVar4 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_02,iVar3));
    if (TVar4 == EOpNull) {
      variable_local =
           (TVariable *)convertInitializerList(this,loc,(TType *)&d,initializer,(TIntermTyped *)0x0)
      ;
    }
  }
  if (variable_local == (TVariable *)0x0) {
    if (skeletalType.spirvType._4_4_ == 2) {
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x50))();
      *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffffffff80;
    }
    this_local = (HlslParseContext *)0x0;
  }
  else {
    iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0xf0))();
    if ((uVar7 & 1) != 0) {
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0xf8))();
      if ((uVar7 & 1) != 0) {
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        iVar5 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
        iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x78))();
        TType::changeOuterArraySize((TType *)CONCAT44(extraout_var_06,iVar3),iVar5);
      }
    }
    iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
    bVar2 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_08,iVar3));
    if (bVar2) {
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      bVar2 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_09,iVar3));
      if (bVar2) {
        iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
        pTVar8 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x98))();
        iVar3 = TArraySizes::getNumDims(pTVar8);
        iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        pTVar8 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 0x98))();
        iVar5 = TArraySizes::getNumDims(pTVar8);
        if (iVar3 == iVar5) {
          local_d8 = 1;
          while( true ) {
            iVar3 = local_d8;
            iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
            pTVar8 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0x98))()
            ;
            iVar5 = TArraySizes::getNumDims(pTVar8);
            if (iVar5 <= iVar3) break;
            iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
            pTVar8 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_13,iVar3) + 0x98))()
            ;
            iVar3 = TArraySizes::getDimSize(pTVar8,local_d8);
            if (iVar3 == 0) {
              iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
              pTVar8 = (TArraySizes *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar3) + 0xa0))();
              iVar3 = local_d8;
              iVar5 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
              this_01 = (TArraySizes *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar5) + 0x98))();
              iVar5 = TArraySizes::getDimSize(this_01,local_d8);
              TArraySizes::setDimSize(pTVar8,iVar3,iVar5);
            }
            local_d8 = local_d8 + 1;
          }
        }
      }
    }
    if (skeletalType.spirvType._4_4_ == 5) {
      iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar3) + 0x58))();
      if (((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 2) {
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        pool_allocator<char>::pool_allocator(&local_130);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_128,"",&local_130);
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&intermSymbol);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_158,"",(pool_allocator<char> *)&intermSymbol);
        TType::getCompleteString
                  (&local_100,(TType *)CONCAT44(extraout_var_17,iVar3),false,true,true,true,
                   &local_128,&local_158);
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (&local_100);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"uniform initializers must be constant","=","\'%s\'",pcVar9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_100);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_158);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_128);
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar3) + 0x50))();
        *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffffffff80;
        this_local = (HlslParseContext *)0x0;
        goto LAB_0064968e;
      }
    }
    if (skeletalType.spirvType._4_4_ == 2) {
      iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar3) + 0x58))();
      if (((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 2) {
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar3) + 0x50))();
        *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffffffff80 | 0x13;
        skeletalType.spirvType._4_4_ = 0x13;
      }
    }
    if ((skeletalType.spirvType._4_4_ == 2) || (skeletalType.spirvType._4_4_ == 5)) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      variable_local =
           (TVariable *)
           TIntermediate::addConversion
                     (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_21,iVar3),
                      (TIntermTyped *)variable_local);
      if (variable_local != (TVariable *)0x0) {
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        iVar5 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
        bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_22,iVar3),
                                  (TType *)CONCAT44(extraout_var_23,iVar5));
        if (bVar2) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
          variable_local =
               (TVariable *)
               TIntermediate::addUniShapeConversion
                         (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_24,iVar3),
                          (TIntermTyped *)variable_local);
        }
      }
      if ((variable_local != (TVariable *)0x0) &&
         (iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[5])(),
         CONCAT44(extraout_var_25,iVar3) != 0)) {
        iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        iVar5 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
        bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_26,iVar3),
                                  (TType *)CONCAT44(extraout_var_27,iVar5));
        if (!bVar2) {
          iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[5])();
          pTVar10 = TIntermConstantUnion::getConstArray
                              ((TIntermConstantUnion *)CONCAT44(extraout_var_30,iVar3));
          (*(variable->super_TSymbol)._vptr_TSymbol[0x19])(variable,pTVar10);
          this_local = (HlslParseContext *)0x0;
          goto LAB_0064968e;
        }
      }
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      pcVar9 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_28,iVar3));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"non-matching or non-convertible constant type for const initializer",
                 pcVar9,"");
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar3) + 0x50))();
      *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffffffff80;
      this_local = (HlslParseContext *)0x0;
    }
    else {
      iVar3 = (*(variable_local->super_TSymbol)._vptr_TSymbol[0x1e])();
      specializationCheck(this,loc,(TType *)CONCAT44(extraout_var_31,iVar3),"initializer");
      initNode = (TIntermNode *)
                 TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            variable,loc);
      local_170 = (HlslParseContext *)
                  handleAssign(this,loc,EOpAssign,(TIntermTyped *)initNode,
                               (TIntermTyped *)variable_local);
      if (local_170 == (HlslParseContext *)0x0) {
        TIntermTyped::getCompleteString_abi_cxx11_(&local_198,(TIntermTyped *)initNode,false);
        TIntermTyped::getCompleteString_abi_cxx11_(&local_1c0,(TIntermTyped *)variable_local,false);
        assignError(this,loc,"=",&local_198,&local_1c0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_1c0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_198);
      }
      this_local = local_170;
    }
  }
LAB_0064968e:
  local_d4 = 1;
  TType::~TType((TType *)&d);
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* HlslParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    if (initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull)
        initializer = convertInitializerList(loc, skeletalType, initializer, nullptr);
    if (initializer == nullptr) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
        variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniform and global consts require a constant initializer
    if (qualifier == EvqUniform && initializer->getType().getQualifier().storage != EvqConst) {
        error(loc, "uniform initializers must be constant", "=", "'%s'", variable->getType().getCompleteString().c_str());
        variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Const variables require a constant initializer
    if (qualifier == EvqConst) {
        if (initializer->getType().getQualifier().storage != EvqConst) {
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (initializer != nullptr && variable->getType() != initializer->getType())
            initializer = intermediate.addUniShapeConversion(EOpAssign, variable->getType(), initializer);
        if (initializer == nullptr || !initializer->getAsConstantUnion() ||
                                      variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().storage = EvqTemporary;
            return nullptr;
        }

        variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermNode* initNode = handleAssign(loc, EOpAssign, intermSymbol, initializer);
        if (initNode == nullptr)
            assignError(loc, "=", intermSymbol->getCompleteString(), initializer->getCompleteString());
        return initNode;
    }

    return nullptr;
}